

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saig.h
# Opt level: O0

Aig_Obj_t * Saig_ObjLoToLi(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ObjIsLo(p,pObj);
  if (iVar1 != 0) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    iVar2 = Aig_ObjCioId(pObj);
    iVar3 = Saig_ManPiNum(p);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,(iVar1 + iVar2) - iVar3);
    return pAVar4;
  }
  __assert_fail("Saig_ObjIsLo(p, pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

static inline Aig_Obj_t *  Saig_ObjLoToLi( Aig_Man_t * p, Aig_Obj_t * pObj )  { assert(Saig_ObjIsLo(p, pObj)); return (Aig_Obj_t *)Vec_PtrEntry(p->vCos, Saig_ManPoNum(p)+Aig_ObjCioId(pObj)-Saig_ManPiNum(p));   }